

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void av1_highbd_inv_txfm2d_add_universe_sse4_1
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  byte bVar1;
  char *pcVar2;
  transform_1d_sse4_1 p_Var3;
  transform_1d_sse4_1 p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  byte bVar11;
  uint uVar12;
  __m128i *palVar13;
  int32_t *piVar14;
  undefined8 *puVar15;
  undefined1 (*pauVar16) [16];
  longlong *plVar17;
  byte bVar18;
  undefined7 in_register_00000009;
  long lVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined8 *puVar28;
  ulong uVar29;
  long lVar30;
  longlong *plVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  bool bVar36;
  __m128i round;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar41 [16];
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined1 auVar44 [16];
  int iVar45;
  int iVar46;
  int iVar61;
  int iVar62;
  undefined1 in_XMM2 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar64;
  int iVar71;
  int iVar72;
  undefined1 in_XMM3 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i buf1 [1024];
  int local_44cc;
  int local_44c8;
  byte local_4450;
  byte local_443c;
  undefined8 local_4438;
  undefined8 uStack_4430;
  undefined4 auStack_4428 [4];
  undefined4 auStack_4418 [4];
  undefined8 uStack_4408;
  undefined8 uStack_4400;
  longlong local_4038 [6];
  undefined8 local_4008 [2043];
  
  bVar18 = (byte)bd;
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    break;
  case 9:
    uVar23 = tx_size_wide[tx_size];
    uVar32 = tx_size_high[tx_size];
    uVar34 = (ulong)uVar32;
    uVar12 = 0x20;
    if ((int)uVar32 < 0x20) {
      uVar12 = uVar32;
    }
    uVar24 = 0x20;
    if ((int)uVar23 < 0x20) {
      uVar24 = uVar23;
    }
    uVar27 = (int)uVar24 >> 2;
    local_44c8 = 0;
    if (uVar23 != uVar32) {
      if ((int)uVar32 < (int)uVar23) {
        local_44c8 = 1;
        if ((uVar32 * 2 == uVar23) || (local_44c8 = 2, uVar32 * 4 == uVar23)) goto LAB_003f7308;
      }
      else {
        local_44c8 = -1;
        if ((uVar23 * 2 == uVar32) || (local_44c8 = -2, uVar23 * 4 == uVar32)) goto LAB_003f7308;
      }
      local_44c8 = 0;
    }
LAB_003f7308:
    lVar30 = (long)(int)uVar32;
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_high_log2[tx_size] + -2][""[tx_type]][0];
    if (0 < (int)uVar12 >> 2) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_wide_log2[tx_size] + -2][""[tx_type]]
               [0];
      uVar21 = (ulong)uVar24;
      puVar28 = local_4008;
      uVar29 = 0;
      auVar43 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar58 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        plVar31 = (longlong *)input;
        palVar13 = (__m128i *)&local_4438;
        uVar22 = uVar21;
        do {
          lVar10 = plVar31[1];
          (*palVar13)[0] = *plVar31;
          (*palVar13)[1] = lVar10;
          palVar13 = palVar13 + 1;
          plVar31 = (longlong *)((long)plVar31 + (long)(int)uVar12 * 4);
          uVar22 = uVar22 - 1;
        } while (uVar22 != 0);
        palVar13 = (__m128i *)&local_4438;
        uVar22 = uVar21;
        if ((local_44c8 == 1) || (local_44c8 == -1)) {
          do {
            auVar54 = pmulld((undefined1  [16])*palVar13,auVar43);
            *(int *)*palVar13 = auVar54._0_4_ + auVar58._0_4_ >> 0xc;
            *(int *)((long)*palVar13 + 4) = auVar54._4_4_ + auVar58._4_4_ >> 0xc;
            *(int *)(*palVar13 + 1) = auVar54._8_4_ + auVar58._8_4_ >> 0xc;
            *(int *)((long)*palVar13 + 0xc) = auVar54._12_4_ + auVar58._12_4_ >> 0xc;
            uVar22 = uVar22 - 1;
            palVar13 = palVar13 + 1;
          } while (uVar22 != 0);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar44._8_8_ = extraout_XMM1_Qb_02;
        auVar44._0_8_ = extraout_XMM1_Qa_02;
        if (0 < (int)uVar27) {
          lVar33 = 0;
          puVar15 = puVar28;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar33 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar33 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar33 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar33 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar33);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar33);
            auVar40._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar33 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar33 + -8));
            auVar40._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar33 + -4);
            auVar40._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar33 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar33);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar33);
            auVar58._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar33),
                          *(undefined4 *)((long)auStack_4418 + lVar33 + 8));
            auVar58._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar33 + 0xc);
            auVar58._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar33 + 4);
            *(undefined1 (*) [16])((long)&local_4438 + lVar33) = in_XMM3;
            *(undefined4 *)((long)auStack_4428 + lVar33 + 8) = uVar7;
            *(undefined4 *)((long)auStack_4428 + lVar33 + 0xc) = uVar5;
            *(undefined4 *)((long)auStack_4418 + lVar33) = uVar8;
            *(undefined4 *)((long)auStack_4418 + lVar33 + 4) = uVar6;
            auVar44._8_8_ = auVar58._0_8_;
            auVar44._0_8_ = auVar40._0_8_;
            *(undefined1 (*) [16])((long)auStack_4418 + lVar33) = auVar44;
            *(long *)((long)&uStack_4408 + lVar33) = auVar40._8_8_;
            *(long *)((long)&uStack_4400 + lVar33) = auVar58._8_8_;
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar44;
            *puVar15 = auVar40._8_8_;
            puVar15[1] = auVar58._8_8_;
            lVar33 = lVar33 + 0x40;
            puVar15 = puVar15 + lVar30 * 2;
          } while ((ulong)uVar27 << 6 != lVar33);
        }
        uVar29 = uVar29 + 1;
        input = (int32_t *)((long)input + 0x10);
        puVar28 = puVar28 + 8;
        auVar43 = pmovsxwd(auVar44,0xb500b500b500b50);
        auVar58 = pmovsxwd(auVar58,0x800080008000800);
      } while (uVar29 != (uint)((int)uVar12 >> 2));
    }
    if (0 < (int)uVar27) {
      plVar31 = local_4038;
      uVar21 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar21 * lVar30 * 2),
                  (__m128i *)(local_4038 + uVar21 * lVar30 * 2),0xc,1,bd,0);
        bVar11 = pcVar2[1];
        plVar17 = plVar31;
        uVar29 = uVar34;
        if ((char)bVar11 < '\0') {
          iVar73 = 1 << (~bVar11 & 0x1f);
          auVar43 = ZEXT416((uint)-(int)(char)bVar11);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar73 >> auVar43;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar73 >> auVar43;
            plVar17 = plVar17 + 2;
            uVar29 = uVar29 - 1;
          } while (uVar29 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar29 = uVar29 - 1;
          } while (uVar29 != 0);
        }
        uVar21 = uVar21 + 1;
        plVar31 = plVar31 + lVar30 * 2;
      } while (uVar21 != uVar27);
    }
    if ((int)uVar23 >> 3 < 1) {
      return;
    }
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    uVar12 = ~(-1 << (bVar18 & 0x1f));
    iVar73 = 0;
    uVar21 = 0;
    do {
      plVar31 = local_4038 + (long)iVar73 * 2;
      pauVar16 = pauVar20;
      uVar29 = uVar34;
      do {
        auVar43 = *pauVar16;
        auVar54 = pmovsxwd(in_XMM3,auVar43);
        auVar59._8_4_ = auVar43._8_4_;
        auVar59._12_4_ = auVar43._12_4_;
        auVar59._0_8_ = auVar43._8_8_;
        iVar72 = auVar54._0_4_ + (int)*plVar31;
        iVar71 = auVar54._4_4_ + *(int *)((long)plVar31 + 4);
        iVar64 = auVar54._8_4_ + (int)plVar31[1];
        iVar63 = auVar54._12_4_ + *(int *)((long)plVar31 + 0xc);
        auVar43 = pmovsxwd(auVar59,auVar59);
        plVar17 = plVar31 + uVar34 * 2;
        iVar46 = auVar43._0_4_ + (int)*plVar17;
        iVar62 = auVar43._4_4_ + *(int *)((long)plVar17 + 4);
        iVar45 = auVar43._8_4_ + (int)plVar17[1];
        iVar61 = auVar43._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar71 = (uint)(-1 < iVar71) * iVar71;
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        auVar70._0_4_ = ((int)uVar12 < iVar72) * uVar12 | (uint)((int)uVar12 >= iVar72) * iVar72;
        auVar70._4_4_ = ((int)uVar12 < iVar71) * uVar12 | (uint)((int)uVar12 >= iVar71) * iVar71;
        auVar70._8_4_ = ((int)uVar12 < iVar64) * uVar12 | (uint)((int)uVar12 >= iVar64) * iVar64;
        auVar70._12_4_ = ((int)uVar12 < iVar63) * uVar12 | (uint)((int)uVar12 >= iVar63) * iVar63;
        iVar46 = (uint)(-1 < iVar46) * iVar46;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar45 = (uint)(-1 < iVar45) * iVar45;
        iVar61 = (uint)(-1 < iVar61) * iVar61;
        auVar60._0_4_ = ((int)uVar12 < iVar46) * uVar12 | (uint)((int)uVar12 >= iVar46) * iVar46;
        auVar60._4_4_ = ((int)uVar12 < iVar62) * uVar12 | (uint)((int)uVar12 >= iVar62) * iVar62;
        auVar60._8_4_ = ((int)uVar12 < iVar45) * uVar12 | (uint)((int)uVar12 >= iVar45) * iVar45;
        auVar60._12_4_ = ((int)uVar12 < iVar61) * uVar12 | (uint)((int)uVar12 >= iVar61) * iVar61;
        in_XMM3 = packusdw(auVar70,auVar60);
        *pauVar16 = in_XMM3;
        plVar31 = plVar31 + 2;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
      uVar21 = uVar21 + 1;
      iVar73 = iVar73 + uVar32 * 2;
      pauVar20 = pauVar20 + 1;
    } while (uVar21 != (uint)((int)uVar23 >> 3));
    return;
  case 10:
  case 0xc:
  case 0xe:
    uVar23 = tx_size_high[tx_size];
    lVar30 = (long)(int)uVar23;
    uVar32 = 0x20;
    if ((int)uVar23 < 0x20) {
      uVar32 = uVar23;
    }
    if (eob < (int)uVar32) {
      iVar73 = *(int *)(&DAT_00563a7c + (long)eob * 4);
    }
    else {
      iVar73 = uVar32 - 1;
    }
    uVar34 = (ulong)((uint)tx_size * 4);
    uVar12 = *(uint *)((long)tx_size_wide + uVar34);
    uVar24 = 0x20;
    if ((int)uVar12 < 0x20) {
      uVar24 = uVar12;
    }
    uVar27 = (int)uVar24 >> 2;
    local_44c8 = 0;
    if (uVar12 != uVar23) {
      if ((int)uVar23 < (int)uVar12) {
        local_44c8 = 1;
        if ((uVar23 * 2 == uVar12) || (local_44c8 = 2, uVar23 * 4 == uVar12)) goto LAB_003f689e;
      }
      else {
        local_44c8 = -1;
        if ((uVar12 * 2 == uVar23) || (local_44c8 = -2, uVar12 * 4 == uVar23)) goto LAB_003f689e;
      }
      local_44c8 = 0;
    }
LAB_003f689e:
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    bVar11 = (byte)(tx_type - 4) >> 1;
    bVar36 = 5 < (byte)(bVar11 | tx_type * -0x80);
    bVar11 = 0x18 >> (bVar11 & 0x1f);
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar34) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[iVar73]];
    uVar26 = iVar73 + 8 >> 2 & 0xfffffffe;
    if (0 < (int)uVar26) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr
               [(long)*(int *)((long)tx_size_wide_log2 + uVar34) + -2][""[tx_type]][0];
      uVar34 = (ulong)uVar24;
      puVar28 = local_4008;
      uVar21 = 0;
      auVar43 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar51 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        plVar31 = (longlong *)input;
        palVar13 = (__m128i *)&local_4438;
        uVar29 = uVar34;
        do {
          lVar10 = plVar31[1];
          (*palVar13)[0] = *plVar31;
          (*palVar13)[1] = lVar10;
          palVar13 = palVar13 + 1;
          plVar31 = (longlong *)((long)plVar31 + (long)(int)uVar32 * 4);
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
        palVar13 = (__m128i *)&local_4438;
        uVar29 = uVar34;
        if ((local_44c8 == 1) || (local_44c8 == -1)) {
          do {
            auVar54 = pmulld((undefined1  [16])*palVar13,auVar43);
            *(int *)*palVar13 = auVar54._0_4_ + auVar51._0_4_ >> 0xc;
            *(int *)((long)*palVar13 + 4) = auVar54._4_4_ + auVar51._4_4_ >> 0xc;
            *(int *)(*palVar13 + 1) = auVar54._8_4_ + auVar51._8_4_ >> 0xc;
            *(int *)((long)*palVar13 + 0xc) = auVar54._12_4_ + auVar51._12_4_ >> 0xc;
            uVar29 = uVar29 - 1;
            palVar13 = palVar13 + 1;
          } while (uVar29 != 0);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar42._8_8_ = extraout_XMM1_Qb_00;
        auVar42._0_8_ = extraout_XMM1_Qa_00;
        if (0 < (int)uVar27) {
          lVar33 = 0;
          puVar15 = puVar28;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar33 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar33 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar33 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar33 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar33);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar33);
            auVar38._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar33 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar33 + -8));
            auVar38._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar33 + -4);
            auVar38._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar33 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar33);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar33);
            auVar51._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar33),
                          *(undefined4 *)((long)auStack_4418 + lVar33 + 8));
            auVar51._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar33 + 0xc);
            auVar51._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar33 + 4);
            *(undefined1 (*) [16])((long)&local_4438 + lVar33) = in_XMM3;
            *(undefined4 *)((long)auStack_4428 + lVar33 + 8) = uVar7;
            *(undefined4 *)((long)auStack_4428 + lVar33 + 0xc) = uVar5;
            *(undefined4 *)((long)auStack_4418 + lVar33) = uVar8;
            *(undefined4 *)((long)auStack_4418 + lVar33 + 4) = uVar6;
            auVar42._8_8_ = auVar51._0_8_;
            auVar42._0_8_ = auVar38._0_8_;
            *(undefined1 (*) [16])((long)auStack_4418 + lVar33) = auVar42;
            *(long *)((long)&uStack_4408 + lVar33) = auVar38._8_8_;
            *(long *)((long)&uStack_4400 + lVar33) = auVar51._8_8_;
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar42;
            *puVar15 = auVar38._8_8_;
            puVar15[1] = auVar51._8_8_;
            lVar33 = lVar33 + 0x40;
            puVar15 = puVar15 + lVar30 * 2;
          } while ((ulong)uVar27 << 6 != lVar33);
        }
        uVar21 = uVar21 + 1;
        input = (int32_t *)((long)input + 0x10);
        puVar28 = puVar28 + 8;
        auVar43 = pmovsxwd(auVar42,0xb500b500b500b50);
        auVar51 = pmovsxwd(auVar51,0x800080008000800);
      } while (uVar21 != uVar26);
    }
    if (0 < (int)uVar27) {
      plVar31 = local_4038;
      uVar34 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar34 * lVar30 * 2),
                  (__m128i *)(local_4038 + uVar34 * lVar30 * 2),0xc,1,bd,0);
        bVar1 = pcVar2[1];
        plVar17 = plVar31;
        uVar21 = (ulong)uVar23;
        if ((char)bVar1 < '\0') {
          iVar73 = 1 << (~bVar1 & 0x1f);
          auVar43 = ZEXT416((uint)-(int)(char)bVar1);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar73 >> auVar43;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar73 >> auVar43;
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar1;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar34 = uVar34 + 1;
        plVar31 = plVar31 + lVar30 * 2;
      } while (uVar34 != uVar27);
    }
    if ((int)uVar12 >> 3 < 1) {
      return;
    }
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    uVar32 = ~(-1 << (bVar18 & 0x1f));
    uVar21 = 0;
    uVar34 = lVar30 - 1;
    if (bVar36 || (bVar11 & 1) != 0) {
      uVar34 = uVar21;
    }
    uVar29 = 0;
    do {
      plVar31 = local_4038 + (long)(int)uVar21 * 2 + uVar34 * 2;
      pauVar16 = pauVar20;
      lVar33 = lVar30;
      do {
        auVar43 = *pauVar16;
        auVar54 = pmovsxwd(in_XMM3,auVar43);
        auVar52._8_4_ = auVar43._8_4_;
        auVar52._12_4_ = auVar43._12_4_;
        auVar52._0_8_ = auVar43._8_8_;
        iVar64 = auVar54._0_4_ + (int)*plVar31;
        iVar71 = auVar54._4_4_ + *(int *)((long)plVar31 + 4);
        iVar72 = auVar54._8_4_ + (int)plVar31[1];
        iVar73 = auVar54._12_4_ + *(int *)((long)plVar31 + 0xc);
        auVar43 = pmovsxwd(auVar52,auVar52);
        plVar17 = plVar31 + lVar30 * 2;
        iVar61 = auVar43._0_4_ + (int)*plVar17;
        iVar62 = auVar43._4_4_ + *(int *)((long)plVar17 + 4);
        iVar63 = auVar43._8_4_ + (int)plVar17[1];
        iVar45 = auVar43._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        iVar71 = (uint)(-1 < iVar71) * iVar71;
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar73 = (uint)(-1 < iVar73) * iVar73;
        auVar67._0_4_ = ((int)uVar32 < iVar64) * uVar32 | (uint)((int)uVar32 >= iVar64) * iVar64;
        auVar67._4_4_ = ((int)uVar32 < iVar71) * uVar32 | (uint)((int)uVar32 >= iVar71) * iVar71;
        auVar67._8_4_ = ((int)uVar32 < iVar72) * uVar32 | (uint)((int)uVar32 >= iVar72) * iVar72;
        auVar67._12_4_ = ((int)uVar32 < iVar73) * uVar32 | (uint)((int)uVar32 >= iVar73) * iVar73;
        iVar61 = (uint)(-1 < iVar61) * iVar61;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        iVar45 = (uint)(-1 < iVar45) * iVar45;
        auVar53._0_4_ = ((int)uVar32 < iVar61) * uVar32 | (uint)((int)uVar32 >= iVar61) * iVar61;
        auVar53._4_4_ = ((int)uVar32 < iVar62) * uVar32 | (uint)((int)uVar32 >= iVar62) * iVar62;
        auVar53._8_4_ = ((int)uVar32 < iVar63) * uVar32 | (uint)((int)uVar32 >= iVar63) * iVar63;
        auVar53._12_4_ = ((int)uVar32 < iVar45) * uVar32 | (uint)((int)uVar32 >= iVar45) * iVar45;
        in_XMM3 = packusdw(auVar67,auVar53);
        *pauVar16 = in_XMM3;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        plVar31 = (longlong *)((long)plVar31 + ((ulong)(((bVar36 | bVar11) & 1) << 5) - 0x10));
        lVar33 = lVar33 + -1;
      } while (lVar33 != 0);
      uVar29 = uVar29 + 1;
      pauVar20 = pauVar20 + 1;
      uVar21 = (ulong)((int)uVar21 + uVar23 * 2);
    } while (uVar29 != (uint)((int)uVar12 >> 3));
    return;
  case 0xb:
  case 0xd:
  case 0xf:
    uVar23 = tx_size_wide[tx_size];
    uVar32 = 0x20;
    if ((int)uVar23 < 0x20) {
      uVar32 = uVar23;
    }
    if (eob < (int)uVar32) {
      uVar12 = *(uint *)(&DAT_00563a7c + (long)eob * 4);
    }
    else {
      uVar12 = uVar32 - 1;
    }
    uVar34 = (ulong)((uint)tx_size * 4);
    uVar24 = *(uint *)((long)tx_size_high + uVar34);
    lVar30 = (long)(int)uVar24;
    uVar32 = (int)uVar32 >> 2;
    uVar27 = 0x20;
    if ((int)uVar24 < 0x20) {
      uVar27 = uVar24;
    }
    local_44cc = 0;
    if (uVar23 != uVar24) {
      if ((int)uVar24 < (int)uVar23) {
        local_44cc = 1;
        if ((uVar24 * 2 != uVar23) && (local_44cc = 2, uVar24 * 4 != uVar23)) {
LAB_003f774b:
          local_44cc = 0;
        }
      }
      else {
        local_44cc = -1;
        if ((uVar23 * 2 != uVar24) && (local_44cc = -2, uVar23 * 4 != uVar24)) goto LAB_003f774b;
      }
    }
    pcVar2 = av1_inv_txfm_shift_ls[tx_size];
    p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar34) + -2]
             [""[tx_type]][0];
    bVar36 = 0xf < tx_type;
    uVar26 = 0xbeaf >> (tx_type & 0x1f);
    if (0 < (int)uVar27 >> 2) {
      p_Var4 = highbd_txfm_all_1d_zeros_w8_arr
               [(long)*(int *)((long)tx_size_wide_log2 + uVar34) + -2][""[tx_type]]
               [lowbd_txfm_all_1d_zeros_idx[(int)uVar12]];
      lVar33 = (ulong)((uVar12 & 0xfffffff8) + 8) << 4;
      lVar35 = (ulong)uVar32 << 6;
      pauVar20 = (undefined1 (*) [16])(local_4008 + ((long)(int)uVar32 + -1) * lVar30 * 2);
      puVar28 = local_4008;
      uVar34 = 0;
      auVar43 = pmovsxwd(in_XMM1,0xb500b500b500b50);
      auVar54 = pmovsxwd(in_XMM2,0x800080008000800);
      do {
        if (-1 < (int)uVar12) {
          lVar19 = 0;
          piVar14 = input;
          do {
            uVar9 = *(undefined8 *)(piVar14 + 2);
            *(undefined8 *)((long)&local_4438 + lVar19) = *(undefined8 *)piVar14;
            *(undefined8 *)((long)auStack_4428 + lVar19 + -8) = uVar9;
            lVar19 = lVar19 + 0x10;
            piVar14 = piVar14 + (int)uVar27;
          } while (lVar33 != lVar19);
        }
        if (((local_44cc == 1) || (local_44cc == -1)) && (-1 < (int)uVar12)) {
          lVar19 = 0;
          do {
            auVar39 = pmulld(*(undefined1 (*) [16])((long)&local_4438 + lVar19),auVar43);
            *(int *)((long)&local_4438 + lVar19) = auVar39._0_4_ + auVar54._0_4_ >> 0xc;
            *(int *)((long)&local_4438 + lVar19 + 4) = auVar39._4_4_ + auVar54._4_4_ >> 0xc;
            *(int *)((long)auStack_4428 + lVar19 + -8) = auVar39._8_4_ + auVar54._8_4_ >> 0xc;
            *(int *)((long)auStack_4428 + lVar19 + -4) = auVar39._12_4_ + auVar54._12_4_ >> 0xc;
            lVar19 = lVar19 + 0x10;
          } while (lVar33 != lVar19);
        }
        (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
        auVar43._8_8_ = extraout_XMM1_Qb_01;
        auVar43._0_8_ = extraout_XMM1_Qa_01;
        if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar36) {
          if (0 < (int)uVar32) {
            lVar19 = 0;
            pauVar16 = pauVar20;
            do {
              auVar39 = *(undefined1 (*) [16])((long)auStack_4428 + lVar19);
              uVar5 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
              uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
              auVar68._0_8_ =
                   CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19 + 8),
                            *(undefined4 *)((long)&uStack_4400 + lVar19));
              auVar68._8_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
              auVar68._12_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
              auVar55._0_8_ = auVar39._0_8_;
              auVar55._8_4_ = auVar39._4_4_;
              auVar55._12_4_ = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
              auVar54._8_8_ = auVar55._8_8_;
              auVar54._0_8_ = CONCAT44(*(undefined4 *)((long)&local_4438 + lVar19),auVar39._0_4_);
              auVar43._0_8_ =
                   CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + -8),auVar39._8_4_);
              auVar43._8_4_ = auVar39._12_4_;
              auVar43._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
              *(ulong *)pauVar16[-3] =
                   CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19),
                            *(undefined4 *)((long)&uStack_4408 + lVar19));
              *(undefined8 *)((long)pauVar16[-3] + 8) = auVar54._0_8_;
              *(undefined4 *)((long)pauVar16[-2] + 8) = uVar6;
              *(undefined4 *)((long)pauVar16[-2] + 0xc) = uVar5;
              *(undefined8 *)((long)pauVar16[-2] + 8) = auVar54._8_8_;
              *(undefined8 *)pauVar16[-1] = auVar68._0_8_;
              *(undefined8 *)((long)pauVar16[-1] + 8) = auVar43._0_8_;
              in_XMM3._8_8_ = auVar43._8_8_;
              in_XMM3._0_8_ = auVar68._8_8_;
              *pauVar16 = in_XMM3;
              lVar19 = lVar19 + 0x40;
              pauVar16 = pauVar16 + -lVar30;
            } while (lVar35 != lVar19);
          }
        }
        else if (0 < (int)uVar32) {
          lVar19 = 0;
          puVar15 = puVar28;
          do {
            uVar7 = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
            uVar5 = *(undefined4 *)((long)auStack_4428 + lVar19 + 4);
            uVar8 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
            in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar19);
            in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar19);
            auVar39._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + 8),
                          *(undefined4 *)((long)auStack_4428 + lVar19 + -8));
            auVar39._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
            auVar39._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + 0xc);
            in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar19);
            in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19);
            auVar54._0_8_ =
                 CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar19),
                          *(undefined4 *)((long)auStack_4418 + lVar19 + 8));
            auVar54._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
            auVar54._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
            *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
            *(undefined4 *)(puVar15 + -3) = uVar7;
            *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
            *(undefined4 *)(puVar15 + -2) = uVar8;
            *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
            auVar43._8_8_ = auVar54._0_8_;
            auVar43._0_8_ = auVar39._0_8_;
            *(undefined1 (*) [16])(puVar15 + -2) = auVar43;
            *puVar15 = auVar39._8_8_;
            puVar15[1] = auVar54._8_8_;
            lVar19 = lVar19 + 0x40;
            puVar15 = puVar15 + lVar30 * 2;
          } while (lVar35 != lVar19);
        }
        uVar34 = uVar34 + 1;
        input = input + 4;
        pauVar20 = pauVar20 + 4;
        puVar28 = puVar28 + 8;
        auVar43 = pmovsxwd(auVar43,0xb500b500b500b50);
        auVar54 = pmovsxwd(auVar54,0x800080008000800);
      } while (uVar34 != (uint)((int)uVar27 >> 2));
    }
    if (0 < (int)uVar32) {
      plVar31 = local_4038;
      uVar34 = 0;
      do {
        (*p_Var3)((__m128i *)(local_4038 + uVar34 * lVar30 * 2),
                  (__m128i *)(local_4038 + uVar34 * lVar30 * 2),0xc,1,bd,0);
        bVar11 = pcVar2[1];
        plVar17 = plVar31;
        uVar21 = (ulong)uVar24;
        if ((char)bVar11 < '\0') {
          iVar73 = 1 << (~bVar11 & 0x1f);
          auVar43 = ZEXT416((uint)-(int)(char)bVar11);
          do {
            *(int *)plVar17 = (int)*plVar17 + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar73 >> auVar43;
            *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar73 >> auVar43;
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar73 >> auVar43;
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        else {
          do {
            *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
            *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
            *(int *)(plVar17 + 1) = (int)plVar17[1];
            *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
            plVar17 = plVar17 + 2;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar34 = uVar34 + 1;
        plVar31 = plVar31 + lVar30 * 2;
      } while (uVar34 != uVar32);
    }
    if (0 < (int)uVar23 >> 3) {
      pauVar20 = (undefined1 (*) [16])((long)output * 2);
      local_443c = (byte)uVar26;
      uVar32 = ~(-1 << (bVar18 & 0x1f));
      uVar21 = 0;
      uVar34 = lVar30 - 1;
      if (bVar36 || (uVar26 & 1) != 0) {
        uVar34 = uVar21;
      }
      uVar29 = 0;
      do {
        plVar31 = local_4038 + (long)(int)uVar21 * 2 + uVar34 * 2;
        pauVar16 = pauVar20;
        lVar33 = lVar30;
        do {
          auVar43 = *pauVar16;
          auVar54 = pmovsxwd(in_XMM3,auVar43);
          auVar56._8_4_ = auVar43._8_4_;
          auVar56._12_4_ = auVar43._12_4_;
          auVar56._0_8_ = auVar43._8_8_;
          iVar64 = auVar54._0_4_ + (int)*plVar31;
          iVar71 = auVar54._4_4_ + *(int *)((long)plVar31 + 4);
          iVar72 = auVar54._8_4_ + (int)plVar31[1];
          iVar73 = auVar54._12_4_ + *(int *)((long)plVar31 + 0xc);
          auVar43 = pmovsxwd(auVar56,auVar56);
          plVar17 = plVar31 + lVar30 * 2;
          iVar45 = auVar43._0_4_ + (int)*plVar17;
          iVar61 = auVar43._4_4_ + *(int *)((long)plVar17 + 4);
          iVar62 = auVar43._8_4_ + (int)plVar17[1];
          iVar63 = auVar43._12_4_ + *(int *)((long)plVar17 + 0xc);
          iVar64 = (uint)(-1 < iVar64) * iVar64;
          iVar71 = (uint)(-1 < iVar71) * iVar71;
          iVar72 = (uint)(-1 < iVar72) * iVar72;
          iVar73 = (uint)(-1 < iVar73) * iVar73;
          auVar69._0_4_ = ((int)uVar32 < iVar64) * uVar32 | (uint)((int)uVar32 >= iVar64) * iVar64;
          auVar69._4_4_ = ((int)uVar32 < iVar71) * uVar32 | (uint)((int)uVar32 >= iVar71) * iVar71;
          auVar69._8_4_ = ((int)uVar32 < iVar72) * uVar32 | (uint)((int)uVar32 >= iVar72) * iVar72;
          auVar69._12_4_ = ((int)uVar32 < iVar73) * uVar32 | (uint)((int)uVar32 >= iVar73) * iVar73;
          iVar45 = (uint)(-1 < iVar45) * iVar45;
          iVar61 = (uint)(-1 < iVar61) * iVar61;
          iVar62 = (uint)(-1 < iVar62) * iVar62;
          iVar63 = (uint)(-1 < iVar63) * iVar63;
          auVar57._0_4_ = ((int)uVar32 < iVar45) * uVar32 | (uint)((int)uVar32 >= iVar45) * iVar45;
          auVar57._4_4_ = ((int)uVar32 < iVar61) * uVar32 | (uint)((int)uVar32 >= iVar61) * iVar61;
          auVar57._8_4_ = ((int)uVar32 < iVar62) * uVar32 | (uint)((int)uVar32 >= iVar62) * iVar62;
          auVar57._12_4_ = ((int)uVar32 < iVar63) * uVar32 | (uint)((int)uVar32 >= iVar63) * iVar63;
          in_XMM3 = packusdw(auVar69,auVar57);
          *pauVar16 = in_XMM3;
          pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
          plVar31 = (longlong *)((long)plVar31 + ((ulong)(((bVar36 | local_443c) & 1) << 5) - 0x10))
          ;
          lVar33 = lVar33 + -1;
        } while (lVar33 != 0);
        uVar29 = uVar29 + 1;
        pauVar20 = pauVar20 + 1;
        uVar21 = (ulong)((int)uVar21 + uVar24 * 2);
      } while (uVar29 != (uint)((int)uVar23 >> 3));
    }
  default:
    goto switchD_003f61a4_default;
  }
  local_44cc = 0;
  uVar23 = 0;
  iVar73 = 0;
  if (eob != 1) {
    uVar23 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
    iVar73 = (int)av1_eob_to_eobxy_default[tx_size]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
  }
  uVar32 = tx_size_wide[tx_size];
  uVar12 = tx_size_high[tx_size];
  lVar30 = (long)(int)uVar12;
  uVar27 = (int)uVar32 >> 2;
  uVar24 = 0x20;
  if ((int)uVar12 < 0x20) {
    uVar24 = uVar12;
  }
  if (uVar32 != uVar12) {
    if ((int)uVar12 < (int)uVar32) {
      local_44cc = 1;
      if ((uVar12 * 2 != uVar32) && (local_44cc = 2, uVar12 * 4 != uVar32)) {
LAB_003f6837:
        local_44cc = 0;
      }
    }
    else {
      local_44cc = -1;
      if ((uVar32 * 2 != uVar12) && (local_44cc = -2, uVar32 * 4 != uVar12)) goto LAB_003f6837;
    }
  }
  pcVar2 = av1_inv_txfm_shift_ls[tx_size];
  bVar36 = 0xf < tx_type;
  uVar25 = 0xbeaf >> (tx_type & 0x1f);
  p_Var3 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_high_log2[tx_size] + -2][""[tx_type]]
           [lowbd_txfm_all_1d_zeros_idx[iVar73]];
  uVar26 = iVar73 + 8 >> 2 & 0xfffffffe;
  if (0 < (int)uVar26) {
    p_Var4 = highbd_txfm_all_1d_zeros_w8_arr[(long)tx_size_wide_log2[tx_size] + -2][""[tx_type]]
             [lowbd_txfm_all_1d_zeros_idx[uVar23]];
    lVar33 = (ulong)((uVar23 & 0xffffff8) << 4) + 0x80;
    lVar35 = (ulong)uVar27 << 6;
    pauVar20 = (undefined1 (*) [16])(local_4008 + ((long)(int)uVar27 + -1) * lVar30 * 2);
    puVar28 = local_4008;
    uVar34 = 0;
    auVar43 = pmovsxwd(in_XMM1,0xb500b500b500b50);
    auVar47 = pmovsxwd(in_XMM2,0x800080008000800);
    do {
      lVar19 = 0;
      piVar14 = input;
      do {
        uVar9 = *(undefined8 *)(piVar14 + 2);
        *(undefined8 *)((long)&local_4438 + lVar19) = *(undefined8 *)piVar14;
        *(undefined8 *)((long)auStack_4428 + lVar19 + -8) = uVar9;
        lVar19 = lVar19 + 0x10;
        piVar14 = piVar14 + (int)uVar24;
      } while (lVar33 != lVar19);
      if ((local_44cc == 1) || (local_44cc == -1)) {
        lVar19 = 0;
        do {
          auVar54 = pmulld(*(undefined1 (*) [16])((long)&local_4438 + lVar19),auVar43);
          *(int *)((long)&local_4438 + lVar19) = auVar54._0_4_ + auVar47._0_4_ >> 0xc;
          *(int *)((long)&local_4438 + lVar19 + 4) = auVar54._4_4_ + auVar47._4_4_ >> 0xc;
          *(int *)((long)auStack_4428 + lVar19 + -8) = auVar54._8_4_ + auVar47._8_4_ >> 0xc;
          *(int *)((long)auStack_4428 + lVar19 + -4) = auVar54._12_4_ + auVar47._12_4_ >> 0xc;
          lVar19 = lVar19 + 0x10;
        } while (lVar33 != lVar19);
      }
      (*p_Var4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0,bd,-(int)*pcVar2);
      auVar41._8_8_ = extraout_XMM1_Qb;
      auVar41._0_8_ = extraout_XMM1_Qa;
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar36) {
        if (0 < (int)uVar27) {
          lVar19 = 0;
          pauVar16 = pauVar20;
          do {
            auVar43 = *(undefined1 (*) [16])((long)auStack_4428 + lVar19);
            uVar5 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
            uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
            auVar65._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19 + 8),
                          *(undefined4 *)((long)&uStack_4400 + lVar19));
            auVar65._8_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
            auVar65._12_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
            auVar48._0_8_ = auVar43._0_8_;
            auVar48._8_4_ = auVar43._4_4_;
            auVar48._12_4_ = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
            auVar47._8_8_ = auVar48._8_8_;
            auVar47._0_8_ = CONCAT44(*(undefined4 *)((long)&local_4438 + lVar19),auVar43._0_4_);
            auVar41._0_8_ =
                 CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + -8),auVar43._8_4_);
            auVar41._8_4_ = auVar43._12_4_;
            auVar41._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
            *(ulong *)pauVar16[-3] =
                 CONCAT44(*(undefined4 *)((long)auStack_4418 + lVar19),
                          *(undefined4 *)((long)&uStack_4408 + lVar19));
            *(undefined8 *)((long)pauVar16[-3] + 8) = auVar47._0_8_;
            *(undefined4 *)((long)pauVar16[-2] + 8) = uVar6;
            *(undefined4 *)((long)pauVar16[-2] + 0xc) = uVar5;
            *(undefined8 *)((long)pauVar16[-2] + 8) = auVar47._8_8_;
            *(undefined8 *)pauVar16[-1] = auVar65._0_8_;
            *(undefined8 *)((long)pauVar16[-1] + 8) = auVar41._0_8_;
            in_XMM3._8_8_ = auVar41._8_8_;
            in_XMM3._0_8_ = auVar65._8_8_;
            *pauVar16 = in_XMM3;
            lVar19 = lVar19 + 0x40;
            pauVar16 = pauVar16 + -lVar30;
          } while (lVar35 != lVar19);
        }
      }
      else if (0 < (int)uVar27) {
        lVar19 = 0;
        puVar15 = puVar28;
        do {
          uVar7 = *(undefined4 *)((long)&local_4438 + lVar19 + 4);
          uVar5 = *(undefined4 *)((long)auStack_4428 + lVar19 + 4);
          uVar8 = *(undefined4 *)((long)auStack_4418 + lVar19 + 4);
          uVar6 = *(undefined4 *)((long)&uStack_4408 + lVar19 + 4);
          in_XMM3._4_4_ = *(undefined4 *)((long)auStack_4428 + lVar19);
          in_XMM3._0_4_ = *(undefined4 *)((long)&local_4438 + lVar19);
          auVar37._0_8_ =
               CONCAT44(*(undefined4 *)((long)auStack_4428 + lVar19 + 8),
                        *(undefined4 *)((long)auStack_4428 + lVar19 + -8));
          auVar37._8_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + -4);
          auVar37._12_4_ = *(undefined4 *)((long)auStack_4428 + lVar19 + 0xc);
          in_XMM3._12_4_ = *(undefined4 *)((long)&uStack_4408 + lVar19);
          in_XMM3._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19);
          auVar47._0_8_ =
               CONCAT44(*(undefined4 *)((long)&uStack_4400 + lVar19),
                        *(undefined4 *)((long)auStack_4418 + lVar19 + 8));
          auVar47._8_4_ = *(undefined4 *)((long)auStack_4418 + lVar19 + 0xc);
          auVar47._12_4_ = *(undefined4 *)((long)&uStack_4400 + lVar19 + 4);
          *(undefined1 (*) [16])(puVar15 + -6) = in_XMM3;
          *(undefined4 *)(puVar15 + -3) = uVar7;
          *(undefined4 *)((long)puVar15 + -0x14) = uVar5;
          *(undefined4 *)(puVar15 + -2) = uVar8;
          *(undefined4 *)((long)puVar15 + -0xc) = uVar6;
          auVar41._8_8_ = auVar47._0_8_;
          auVar41._0_8_ = auVar37._0_8_;
          *(undefined1 (*) [16])(puVar15 + -2) = auVar41;
          *puVar15 = auVar37._8_8_;
          puVar15[1] = auVar47._8_8_;
          lVar19 = lVar19 + 0x40;
          puVar15 = puVar15 + lVar30 * 2;
        } while (lVar35 != lVar19);
      }
      uVar34 = uVar34 + 1;
      input = input + 4;
      pauVar20 = pauVar20 + 4;
      puVar28 = puVar28 + 8;
      auVar43 = pmovsxwd(auVar41,0xb500b500b500b50);
      auVar47 = pmovsxwd(auVar47,0x800080008000800);
    } while (uVar34 != uVar26);
  }
  if (0 < (int)uVar27) {
    plVar31 = local_4038;
    uVar34 = 0;
    do {
      (*p_Var3)((__m128i *)(local_4038 + uVar34 * lVar30 * 2),
                (__m128i *)(local_4038 + uVar34 * lVar30 * 2),0xc,1,bd,0);
      bVar11 = pcVar2[1];
      plVar17 = plVar31;
      uVar21 = (ulong)uVar12;
      if ((char)bVar11 < '\0') {
        iVar73 = 1 << (~bVar11 & 0x1f);
        auVar43 = ZEXT416((uint)-(int)(char)bVar11);
        do {
          *(int *)plVar17 = (int)*plVar17 + iVar73 >> auVar43;
          *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4) + iVar73 >> auVar43;
          *(int *)(plVar17 + 1) = (int)plVar17[1] + iVar73 >> auVar43;
          *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc) + iVar73 >> auVar43;
          plVar17 = plVar17 + 2;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      else {
        do {
          *(int *)plVar17 = (int)*plVar17 << (int)(char)bVar11;
          *(int *)((long)plVar17 + 4) = *(int *)((long)plVar17 + 4);
          *(int *)(plVar17 + 1) = (int)plVar17[1];
          *(int *)((long)plVar17 + 0xc) = *(int *)((long)plVar17 + 0xc);
          plVar17 = plVar17 + 2;
          uVar21 = uVar21 - 1;
        } while (uVar21 != 0);
      }
      uVar34 = uVar34 + 1;
      plVar31 = plVar31 + lVar30 * 2;
    } while (uVar34 != uVar27);
  }
  if (0 < (int)uVar32 >> 3) {
    pauVar20 = (undefined1 (*) [16])((long)output * 2);
    local_4450 = (byte)uVar25;
    uVar23 = ~(-1 << (bVar18 & 0x1f));
    uVar21 = 0;
    uVar34 = lVar30 - 1;
    if (bVar36 || (uVar25 & 1) != 0) {
      uVar34 = uVar21;
    }
    uVar29 = 0;
    do {
      plVar31 = local_4038 + (long)(int)uVar21 * 2 + uVar34 * 2;
      pauVar16 = pauVar20;
      lVar33 = lVar30;
      do {
        auVar43 = *pauVar16;
        auVar54 = pmovsxwd(in_XMM3,auVar43);
        auVar49._8_4_ = auVar43._8_4_;
        auVar49._12_4_ = auVar43._12_4_;
        auVar49._0_8_ = auVar43._8_8_;
        iVar64 = auVar54._0_4_ + (int)*plVar31;
        iVar71 = auVar54._4_4_ + *(int *)((long)plVar31 + 4);
        iVar72 = auVar54._8_4_ + (int)plVar31[1];
        iVar73 = auVar54._12_4_ + *(int *)((long)plVar31 + 0xc);
        auVar43 = pmovsxwd(auVar49,auVar49);
        plVar17 = plVar31 + lVar30 * 2;
        iVar61 = auVar43._0_4_ + (int)*plVar17;
        iVar62 = auVar43._4_4_ + *(int *)((long)plVar17 + 4);
        iVar63 = auVar43._8_4_ + (int)plVar17[1];
        iVar45 = auVar43._12_4_ + *(int *)((long)plVar17 + 0xc);
        iVar64 = (uint)(-1 < iVar64) * iVar64;
        iVar71 = (uint)(-1 < iVar71) * iVar71;
        iVar72 = (uint)(-1 < iVar72) * iVar72;
        iVar73 = (uint)(-1 < iVar73) * iVar73;
        auVar66._0_4_ = ((int)uVar23 < iVar64) * uVar23 | (uint)((int)uVar23 >= iVar64) * iVar64;
        auVar66._4_4_ = ((int)uVar23 < iVar71) * uVar23 | (uint)((int)uVar23 >= iVar71) * iVar71;
        auVar66._8_4_ = ((int)uVar23 < iVar72) * uVar23 | (uint)((int)uVar23 >= iVar72) * iVar72;
        auVar66._12_4_ = ((int)uVar23 < iVar73) * uVar23 | (uint)((int)uVar23 >= iVar73) * iVar73;
        iVar61 = (uint)(-1 < iVar61) * iVar61;
        iVar62 = (uint)(-1 < iVar62) * iVar62;
        iVar63 = (uint)(-1 < iVar63) * iVar63;
        iVar45 = (uint)(-1 < iVar45) * iVar45;
        auVar50._0_4_ = ((int)uVar23 < iVar61) * uVar23 | (uint)((int)uVar23 >= iVar61) * iVar61;
        auVar50._4_4_ = ((int)uVar23 < iVar62) * uVar23 | (uint)((int)uVar23 >= iVar62) * iVar62;
        auVar50._8_4_ = ((int)uVar23 < iVar63) * uVar23 | (uint)((int)uVar23 >= iVar63) * iVar63;
        auVar50._12_4_ = ((int)uVar23 < iVar45) * uVar23 | (uint)((int)uVar23 >= iVar45) * iVar45;
        in_XMM3 = packusdw(auVar66,auVar50);
        *pauVar16 = in_XMM3;
        pauVar16 = (undefined1 (*) [16])(*pauVar16 + (long)stride * 2);
        plVar31 = (longlong *)((long)plVar31 + ((ulong)(((bVar36 | local_4450) & 1) << 5) - 0x10));
        lVar33 = lVar33 + -1;
      } while (lVar33 != 0);
      uVar29 = uVar29 + 1;
      pauVar20 = pauVar20 + 1;
      uVar21 = (ulong)((int)uVar21 + uVar12 * 2);
    } while (uVar29 != (uint)((int)uVar32 >> 3));
  }
switchD_003f61a4_default:
  return;
}

Assistant:

void av1_highbd_inv_txfm2d_add_universe_sse4_1(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob, const int bd) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      highbd_inv_txfm2d_add_no_identity_sse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      highbd_inv_txfm2d_add_h_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      highbd_inv_txfm2d_add_v_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case IDTX:
      highbd_inv_txfm2d_add_idtx_ssse41(input, CONVERT_TO_SHORTPTR(output),
                                        stride, tx_type, tx_size, eob, bd);
      break;
    default: assert(0); break;
  }
}